

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxList.cpp
# Opt level: O2

ostream * amrex::operator<<(ostream *os,BoxList *blist)

{
  pointer pBVar1;
  ostream *poVar2;
  pointer b;
  int count;
  int iVar3;
  IndexType local_34;
  
  b = (blist->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start;
  pBVar1 = (blist->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_finish;
  poVar2 = std::operator<<(os,"(BoxList ");
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  poVar2 = std::operator<<(poVar2,' ');
  poVar2 = operator<<(poVar2,&local_34);
  std::operator<<(poVar2,'\n');
  iVar3 = 1;
  for (; b != pBVar1; b = b + 1) {
    poVar2 = (ostream *)std::ostream::operator<<(os,iVar3);
    poVar2 = std::operator<<(poVar2," : ");
    poVar2 = operator<<(poVar2,b);
    std::operator<<(poVar2,'\n');
    iVar3 = iVar3 + 1;
  }
  poVar2 = std::operator<<(os,')');
  std::operator<<(poVar2,'\n');
  if (((byte)os[*(long *)(*(long *)os + -0x18) + 0x20] & 5) != 0) {
    Error_host("operator<<(ostream&,BoxList&) failed");
  }
  return os;
}

Assistant:

std::ostream&
operator<< (std::ostream& os, const BoxList& blist)
{
    BoxList::const_iterator bli = blist.begin(), End = blist.end();
    os << "(BoxList " << blist.size() << ' ' << blist.ixType() << '\n';
    for (int count = 1; bli != End; ++bli, ++count)
    {
        os << count << " : " << *bli << '\n';
    }
    os << ')' << '\n';

    if (os.fail())
        amrex::Error("operator<<(ostream&,BoxList&) failed");

    return os;
}